

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavInitWindow(ImGuiWindow *window,bool force_reinit)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  byte in_SIL;
  ImGuiWindow *in_RDI;
  bool init_for_nav;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  float fStack_28;
  float in_stack_ffffffffffffffdc;
  float in_stack_ffffffffffffffe0;
  uint3 in_stack_ffffffffffffffe4;
  ImGuiID id;
  
  pIVar3 = GImGui;
  if (in_RDI != GImGui->NavWindow) {
    __assert_fail("window == g.NavWindow",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x20a6,"void ImGui::NavInitWindow(ImGuiWindow *, bool)");
  }
  id = (ImGuiID)in_stack_ffffffffffffffe4;
  if (((in_RDI->Flags & 0x40000U) == 0) &&
     (((((in_RDI->Flags & 0x1000000U) == 0 || ((in_RDI->Flags & 0x4000000U) != 0)) ||
       (in_RDI->NavLastIds[0] == 0)) || ((in_SIL & 1) != 0)))) {
    id = CONCAT13(1,in_stack_ffffffffffffffe4);
  }
  if ((char)(id >> 0x18) == '\0') {
    GImGui->NavId = in_RDI->NavLastIds[0];
    pIVar3->NavFocusScopeId = 0;
  }
  else {
    SetNavID(id,(int)in_stack_ffffffffffffffe0,(ImGuiID)in_stack_ffffffffffffffdc);
    pIVar3->NavInitRequest = true;
    pIVar3->NavInitRequestFromMove = false;
    pIVar3->NavInitResultId = 0;
    ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    IVar1.y = fStack_28;
    IVar1.x = in_stack_ffffffffffffffd4;
    (pIVar3->NavInitResultRectRel).Min = IVar1;
    IVar2.y = in_stack_ffffffffffffffe0;
    IVar2.x = in_stack_ffffffffffffffdc;
    (pIVar3->NavInitResultRectRel).Max = IVar2;
    NavUpdateAnyRequestFlag();
  }
  return;
}

Assistant:

void ImGui::NavInitWindow(ImGuiWindow* window, bool force_reinit)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == g.NavWindow);
    bool init_for_nav = false;
    if (!(window->Flags & ImGuiWindowFlags_NoNavInputs))
        if (!(window->Flags & ImGuiWindowFlags_ChildWindow) || (window->Flags & ImGuiWindowFlags_Popup) || (window->NavLastIds[0] == 0) || force_reinit)
            init_for_nav = true;
    //IMGUI_DEBUG_LOG("[Nav] NavInitWindow() init_for_nav=%d, window=\"%s\", layer=%d\n", init_for_nav, window->Name, g.NavLayer);
    if (init_for_nav)
    {
        SetNavID(0, g.NavLayer, 0);
        g.NavInitRequest = true;
        g.NavInitRequestFromMove = false;
        g.NavInitResultId = 0;
        g.NavInitResultRectRel = ImRect();
        NavUpdateAnyRequestFlag();
    }
    else
    {
        g.NavId = window->NavLastIds[0];
        g.NavFocusScopeId = 0;
    }
}